

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_custom_notification.cxx
# Opt level: O0

ptr<force_vote_msg> nuraft::force_vote_msg::deserialize(buffer *buf)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  buffer *in_RSI;
  element_type *in_RDI;
  ptr<force_vote_msg> pVar1;
  uint8_t version;
  buffer_serializer bs;
  ptr<force_vote_msg> *ret;
  buffer_serializer *in_stack_ffffffffffffffd0;
  
  cs_new<nuraft::force_vote_msg>();
  buffer_serializer::buffer_serializer((buffer_serializer *)&stack0xffffffffffffffd0,in_RSI,LITTLE);
  buffer_serializer::get_u8(in_stack_ffffffffffffffd0);
  pVar1.super___shared_ptr<nuraft::force_vote_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<nuraft::force_vote_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<force_vote_msg>)
         pVar1.super___shared_ptr<nuraft::force_vote_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<force_vote_msg> force_vote_msg::deserialize(buffer& buf) {
    ptr<force_vote_msg> ret = cs_new<force_vote_msg>();
    buffer_serializer bs(buf);
    uint8_t version = bs.get_u8();
    (void)version;
    return ret;
}